

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool q_evaluateRhiConfig(QWidget *w,QPlatformBackingStoreRhiConfig *outConfig,SurfaceType *outType)

{
  char cVar1;
  bool bVar2;
  QDebug *pQVar3;
  char *t;
  QWidget *widget;
  long in_FS_OFFSET;
  Stream *local_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  QWidgetData *local_50;
  QDebug local_48;
  Stream *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QBackingStoreRhiSupport::checkForceRhi(outConfig,outType);
  if (cVar1 == '\0') {
    bVar2 = q_evaluateRhiConfigRecursive(w,outConfig,outType);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_002efb7c;
    }
    QtPrivateLogging::lcWidgetPainting();
    bVar2 = true;
    if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) == 0) goto LAB_002efb7c;
    local_68 = 2;
    local_64._0_4_ = 0;
    local_64._4_1_ = (QPaintDevice)0x0;
    local_64._5_3_ = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = (QWidgetData *)QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_48,"Tree with root");
    local_70 = pQVar3->stream;
    widget = (QWidget *)&local_70;
    *(int *)(local_70 + 0x28) = *(int *)(local_70 + 0x28) + 1;
    operator<<((Stream *)&local_38,widget);
    t = "evaluates to flushing with QRhi";
  }
  else {
    QtPrivateLogging::lcWidgetPainting();
    bVar2 = true;
    if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) == 0) goto LAB_002efb7c;
    local_68 = 2;
    local_64._0_4_ = 0;
    local_64._4_1_ = (QPaintDevice)0x0;
    local_64._5_3_ = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = (QWidgetData *)QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_48,"Tree with root");
    local_40 = pQVar3->stream;
    widget = (QWidget *)&local_40;
    *(int *)(local_40 + 0x28) = *(int *)(local_40 + 0x28) + 1;
    operator<<((Stream *)&local_38,widget);
    t = "evaluated to forced flushing with QRhi";
  }
  bVar2 = true;
  QDebug::operator<<(&local_38,t);
  QDebug::~QDebug(&local_38);
  QDebug::~QDebug((QDebug *)widget);
  QDebug::~QDebug(&local_48);
LAB_002efb7c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool q_evaluateRhiConfig(const QWidget *w, QPlatformBackingStoreRhiConfig *outConfig, QSurface::SurfaceType *outType)
{
    // First, check env.vars. or other means that force the usage of rhi-based
    // flushing with a specific graphics API. This takes precedence over what
    // the widgets themselves declare. This is global, applying to all
    // top-levels.
    if (QBackingStoreRhiSupport::checkForceRhi(outConfig, outType)) {
        qCDebug(lcWidgetPainting) << "Tree with root" << w << "evaluated to forced flushing with QRhi";
        return true;
    }

    // Otherwise, check the widget hierarchy to see if there is a child (or
    // ourselves) that declare the need for rhi-based composition.
    if (q_evaluateRhiConfigRecursive(w, outConfig, outType)) {
        qCDebug(lcWidgetPainting) << "Tree with root" << w << "evaluates to flushing with QRhi";
        return true;
    }

    return false;
}